

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.cpp
# Opt level: O3

void __thiscall
CGL::SceneObjects::DirectionalLight::DirectionalLight
          (DirectionalLight *this,Vector3D *rad,Vector3D *posLight,Vector3D *lightDir)

{
  double dVar1;
  uint uVar2;
  undefined4 uVar3;
  uint uVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  (this->super_SceneLight)._vptr_SceneLight = (_func_int **)&PTR_sample_L_001199a0;
  (this->dirToLight).field_0.field_0.x = 0.0;
  (this->dirToLight).field_0.field_0.y = 0.0;
  (this->dirToLight).field_0.field_0.z = 0.0;
  (this->posLight).field_0.field_0.x = 0.0;
  (this->posLight).field_0.field_0.y = 0.0;
  (this->posLight).field_0.field_0.z = 0.0;
  (this->radiance).field_0.field_0.x = (rad->field_0).field_0.x;
  (this->radiance).field_0.field_0.y = (rad->field_0).field_0.y;
  (this->radiance).field_0.field_0.z = (rad->field_0).field_0.z;
  auVar7._0_8_ = -(posLight->field_0).field_0.z;
  auVar7._8_4_ = 0;
  auVar7._12_4_ = 0x80000000;
  uVar2 = *(uint *)((long)&posLight->field_0 + 4);
  uVar3 = *(undefined4 *)((long)&posLight->field_0 + 8);
  uVar4 = *(uint *)((long)&posLight->field_0 + 0xc);
  *(undefined4 *)&(this->posLight).field_0 = *(undefined4 *)&posLight->field_0;
  *(uint *)((long)&(this->posLight).field_0 + 4) = uVar2 ^ 0x80000000;
  *(undefined4 *)((long)&(this->posLight).field_0 + 8) = uVar3;
  *(uint *)((long)&(this->posLight).field_0 + 0xc) = uVar4 ^ 0x80000000;
  dVar6 = (double)vmovlps_avx(auVar7);
  (this->posLight).field_0.field_0.z = dVar6;
  auVar7 = *(undefined1 (*) [16])(lightDir->field_0).field_2.__vec;
  auVar7 = vdppd_avx(auVar7,auVar7,0x31);
  dVar6 = (lightDir->field_0).field_0.z;
  dVar6 = dVar6 * dVar6 + auVar7._0_8_;
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    auVar8._8_8_ = 0;
    auVar8._0_8_ = dVar6;
    auVar7 = vsqrtsd_avx(auVar8,auVar8);
    dVar6 = auVar7._0_8_;
  }
  dVar6 = -1.0 / dVar6;
  dVar1 = (lightDir->field_0).field_0.z;
  dVar5 = (lightDir->field_0).field_0.y;
  (this->dirToLight).field_0.field_0.x = dVar6 * (lightDir->field_0).field_0.x;
  (this->dirToLight).field_0.field_0.y = dVar6 * dVar5;
  (this->dirToLight).field_0.field_0.z = dVar6 * dVar1;
  return;
}

Assistant:

DirectionalLight::DirectionalLight(const Vector3D rad,const Vector3D posLight,
                                   const Vector3D lightDir)
    : radiance(rad) {
  this->posLight = -posLight;
  dirToLight = -lightDir.unit();
}